

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall
wabt::LoadStoreExpr<(wabt::ExprType)49>::LoadStoreExpr
          (LoadStoreExpr<(wabt::ExprType)49> *this,Opcode opcode,Var *memidx,Address align,
          Address offset,Location *loc)

{
  Var VStack_78;
  
  Var::Var(&VStack_78,memidx);
  MemoryExpr<(wabt::ExprType)49>::MemoryExpr
            (&this->super_MemoryExpr<(wabt::ExprType)49>,&VStack_78,loc);
  Var::~Var(&VStack_78);
  (this->super_MemoryExpr<(wabt::ExprType)49>).super_ExprMixin<(wabt::ExprType)49>.super_Expr.
  _vptr_Expr = (_func_int **)&PTR__MemoryExpr_00235498;
  (this->opcode).enum_ = opcode.enum_;
  this->align = align;
  this->offset = offset;
  return;
}

Assistant:

LoadStoreExpr(Opcode opcode,
                Var memidx,
                Address align,
                Address offset,
                const Location& loc = Location())
      : MemoryExpr<TypeEnum>(memidx, loc),
        opcode(opcode),
        align(align),
        offset(offset) {}